

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

void Abc_NtkCompareCones(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  void **__ptr;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Ptr_t *pVVar4;
  Vec_Ptr_t *__ptr_00;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  size_t __nmemb;
  ulong uVar9;
  long lVar10;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *local_40;
  void *local_38;
  
  pVVar3 = pNtk->vCos;
  __nmemb = (size_t)pVVar3->nSize;
  pvVar2 = malloc(__nmemb * 4);
  pSupps = (int *)malloc(__nmemb * 4);
  if (0 < (long)__nmemb) {
    lVar10 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar3->pArray[lVar10];
      *(int *)((long)pvVar2 + lVar10 * 4) = (int)lVar10;
      pVVar3 = Abc_NtkNodeSupport(pNtk,&pObj,1);
      pSupps[lVar10] = pVVar3->nSize;
      if (pVVar3->pArray != (void **)0x0) {
        free(pVVar3->pArray);
      }
      free(pVVar3);
      lVar10 = lVar10 + 1;
      pVVar3 = pNtk->vCos;
      __nmemb = (size_t)pVVar3->nSize;
    } while (lVar10 < (long)__nmemb);
  }
  qsort(pvVar2,__nmemb,4,Abc_NtkCompareConesCompare);
  pVVar3 = pNtk->vCos;
  uVar6 = (ulong)(uint)pVVar3->nSize;
  if (pVVar3->nSize < 1) {
LAB_001f4b92:
    if (pvVar2 == (void *)0x0) goto LAB_001f4b9f;
  }
  else {
    lVar10 = 0;
    uVar7 = 0;
    local_38 = pvVar2;
    do {
      pObj = (Abc_Obj_t *)pVVar3->pArray[lVar10];
      iVar5 = *(int *)((long)local_38 + lVar10 * 4);
      if (((long)iVar5 < 0) || ((int)uVar6 <= iVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pObj = (Abc_Obj_t *)pVVar3->pArray[iVar5];
      if ((pObj->field_0x14 & 0x10) == 0) {
        pVVar3 = Abc_NtkNodeSupport(pNtk,&pObj,1);
        pVVar4 = Abc_NtkDfsNodes(pNtk,&pObj,1);
        __ptr_00 = Abc_NtkDfsReverseNodesContained(pNtk,(Abc_Obj_t **)pVVar3->pArray,pVVar3->nSize);
        iVar5 = __ptr_00->nSize;
        uVar6 = 0;
        if (2 < (long)iVar5) {
          uVar6 = 0;
          uVar8 = 1;
          do {
            for (pvVar2 = __ptr_00->pArray[uVar8]; pvVar2 != (void *)0x0;
                pvVar2 = *(void **)((long)pvVar2 + 0x40)) {
              uVar6 = (ulong)((int)uVar6 + 1);
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 != iVar5 - 1);
        }
        if (iVar5 < 1) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
        }
        pvVar2 = __ptr_00->pArray[(long)iVar5 + -1];
        local_40 = pVVar4;
        if (pvVar2 == (void *)0x0) {
          uVar8 = 0;
          uVar9 = 0;
        }
        else {
          uVar9 = 0;
          uVar8 = 0;
          do {
            uVar1 = *(uint *)((long)pvVar2 + 0x14);
            if ((uVar1 & 0xf) - 5 < 0xfffffffe) {
              __assert_fail("Abc_ObjIsCo(pTemp)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                            ,0x858,"void Abc_NtkCompareCones(Abc_Ntk_t *)");
            }
            uVar8 = (ulong)((int)uVar8 + 1);
            uVar9 = (ulong)((int)uVar9 + (uint)((uVar1 & 0x10) == 0));
            *(uint *)((long)pvVar2 + 0x14) = uVar1 | 0x10;
            pvVar2 = *(void **)((long)pvVar2 + 0x40);
          } while (pvVar2 != (void *)0x0);
        }
        uVar7 = uVar7 + 1;
        printf("%4d CO %5d :  Supp = %5d.  Lev = %3d.  Cone = %5d.  Rev = %5d.  COs = %3d (%3d).\n",
               (ulong)uVar7,(ulong)*(uint *)((long)local_38 + lVar10 * 4),(ulong)(uint)pVVar3->nSize
               ,(ulong)(*(uint *)((long)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray] + 0x14)
                       >> 0xc),(ulong)(uint)pVVar4->nSize,uVar6,uVar8,uVar9);
        __ptr = pVVar3->pArray;
        if (pVVar3->nSize < 10) {
          if (__ptr != (void **)0x0) {
            free(__ptr);
          }
          free(pVVar3);
          pVVar3 = local_40;
          if (local_40->pArray != (void **)0x0) {
            free(local_40->pArray);
          }
          free(pVVar3);
          if (__ptr_00->pArray != (void **)0x0) {
            free(__ptr_00->pArray);
          }
          free(__ptr_00);
          pVVar3 = pNtk->vCos;
          iVar5 = pVVar3->nSize;
          break;
        }
        if (__ptr != (void **)0x0) {
          free(__ptr);
        }
        free(pVVar3);
        pVVar3 = local_40;
        if (local_40->pArray != (void **)0x0) {
          free(local_40->pArray);
        }
        free(pVVar3);
        if (__ptr_00->pArray != (void **)0x0) {
          free(__ptr_00->pArray);
        }
        free(__ptr_00);
        pVVar3 = pNtk->vCos;
      }
      lVar10 = lVar10 + 1;
      iVar5 = pVVar3->nSize;
      uVar6 = (ulong)iVar5;
    } while (lVar10 < (long)uVar6);
    pvVar2 = local_38;
    if (0 < iVar5) {
      lVar10 = 0;
      do {
        pObj = (Abc_Obj_t *)pVVar3->pArray[lVar10];
        pObj->field_0x14 = pObj->field_0x14 & 0xef;
        lVar10 = lVar10 + 1;
        pVVar3 = pNtk->vCos;
      } while (lVar10 < pVVar3->nSize);
      goto LAB_001f4b92;
    }
  }
  free(pvVar2);
LAB_001f4b9f:
  if (pSupps != (int *)0x0) {
    free(pSupps);
    pSupps = (int *)0x0;
  }
  return;
}

Assistant:

void Abc_NtkCompareCones( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vSupp, * vNodes, * vReverse;
    Abc_Obj_t * pObj, * pTemp;
    int Iter, i, k, Counter, CounterCos, CounterCosNew;
    int * pPerms;

    // sort COs by support size
    pPerms = ABC_ALLOC( int, Abc_NtkCoNum(pNtk) );
    pSupps = ABC_ALLOC( int, Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pPerms[i] = i;
        vSupp = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        pSupps[i] = Vec_PtrSize(vSupp);
        Vec_PtrFree( vSupp );
    }
    qsort( (void *)pPerms, Abc_NtkCoNum(pNtk), sizeof(int), (int (*)(const void *, const void *)) Abc_NtkCompareConesCompare );

    // consider COs in this order
    Iter = 0;
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pObj = Abc_NtkCo( pNtk, pPerms[i] );
        if ( pObj->fMarkA )
            continue;
        Iter++;

        vSupp = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        vNodes = Abc_NtkDfsNodes( pNtk, &pObj, 1 );
        vReverse = Abc_NtkDfsReverseNodesContained( pNtk, (Abc_Obj_t **)Vec_PtrArray(vSupp), Vec_PtrSize(vSupp) );
        // count the number of nodes in the reverse cone
        Counter = 0;
        for ( k = 1; k < Vec_PtrSize(vReverse) - 1; k++ )
            for ( pTemp = (Abc_Obj_t *)Vec_PtrEntry(vReverse, k); pTemp; pTemp = (Abc_Obj_t *)pTemp->pCopy )
                Counter++;
        CounterCos = CounterCosNew = 0;
        for ( pTemp = (Abc_Obj_t *)Vec_PtrEntryLast(vReverse); pTemp; pTemp = (Abc_Obj_t *)pTemp->pCopy )
        {
            assert( Abc_ObjIsCo(pTemp) );
            CounterCos++;
            if ( pTemp->fMarkA == 0 )
                CounterCosNew++;
            pTemp->fMarkA = 1;
        }
        // print statistics
        printf( "%4d CO %5d :  Supp = %5d.  Lev = %3d.  Cone = %5d.  Rev = %5d.  COs = %3d (%3d).\n",
            Iter, pPerms[i], Vec_PtrSize(vSupp), Abc_ObjLevel(Abc_ObjFanin0(pObj)), Vec_PtrSize(vNodes), Counter, CounterCos, CounterCosNew );

        if ( Vec_PtrSize(vSupp) < 10 )
        {
            // free arrays
            Vec_PtrFree( vSupp );
            Vec_PtrFree( vNodes );
            Vec_PtrFree( vReverse );
            break;
        }

        // free arrays
        Vec_PtrFree( vSupp );
        Vec_PtrFree( vNodes );
        Vec_PtrFree( vReverse );

    }
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->fMarkA = 0;

    ABC_FREE( pPerms );
    ABC_FREE( pSupps );
}